

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O0

void __thiscall
SemanticAnalyserTest_UndeclaredVariableInReturnThrows_Test::
~SemanticAnalyserTest_UndeclaredVariableInReturnThrows_Test
          (SemanticAnalyserTest_UndeclaredVariableInReturnThrows_Test *this)

{
  void *in_RDI;
  
  ~SemanticAnalyserTest_UndeclaredVariableInReturnThrows_Test
            ((SemanticAnalyserTest_UndeclaredVariableInReturnThrows_Test *)0x1e8e58);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, UndeclaredVariableInReturnThrows)
{
  std::string source = R"SRC(  
  fn test(): f32
  {
    ret x;
  }

  fn main(): f32
  {
    ret 0;
  }
  )SRC";
  throwTest(source);
}